

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_60cb577c local_e8;
  long *local_e0 [2];
  long local_d0 [2];
  anon_class_40_2_f7e7401d_for__M_pred local_c0 [4];
  
  memset(local_c0,0,0xa8);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_e8.regexMatch = local_c0;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,pcVar1,pcVar1 + name->_M_string_length);
  bVar2 = IsPreExcluded::anon_class_8_1_60cb577c::operator()
                    (&local_e8,
                     (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                     (this->PreIncludeRegexes).
                     super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = IsPreExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_e8,
                       (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *)(this->PreExcludeRegexes).
                          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };

  return !regexSearch(this->PreIncludeRegexes) &&
    regexSearch(this->PreExcludeRegexes);
}